

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.h
# Opt level: O2

int32_t icu_63::UCharsTrie::readValue(char16_t *pos,int32_t leadUnit)

{
  uint uVar1;
  
  if (0x3fff < leadUnit) {
    if ((uint)leadUnit < 0x7fff) {
      uVar1 = leadUnit * 0x10000 + 0xc0000000;
    }
    else {
      uVar1 = (uint)(ushort)*pos << 0x10;
      pos = pos + 1;
    }
    leadUnit = (ushort)*pos | uVar1;
  }
  return leadUnit;
}

Assistant:

static inline int32_t readValue(const char16_t *pos, int32_t leadUnit) {
        int32_t value;
        if(leadUnit<kMinTwoUnitValueLead) {
            value=leadUnit;
        } else if(leadUnit<kThreeUnitValueLead) {
            value=((leadUnit-kMinTwoUnitValueLead)<<16)|*pos;
        } else {
            value=(pos[0]<<16)|pos[1];
        }
        return value;
    }